

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorSpeed.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsMotorSpeed::IntLoadConstraint_C
          (ChShaftsMotorSpeed *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  double *pdVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar6 [64];
  
  auVar6._8_56_ = in_register_00001248;
  auVar6._0_8_ = recovery_clamp;
  uVar2 = (ulong)off_L;
  dVar4 = 0.0;
  if (this->avoid_angle_drift == true) {
    (*(this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj.
      _vptr_ChObj[0x40])();
    dVar4 = (dVar4 - this->aux_dt) - this->rot_offset;
  }
  dVar4 = dVar4 * c;
  if (do_clamp) {
    auVar3._8_8_ = 0x8000000000000000;
    auVar3._0_8_ = 0x8000000000000000;
    auVar3 = vxorpd_avx512vl(auVar6._0_16_,auVar3);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar4;
    auVar3 = vmaxsd_avx(auVar5,auVar3);
    auVar3 = vminsd_avx(auVar3,auVar6._0_16_);
    dVar4 = auVar3._0_8_;
  }
  if ((long)uVar2 <
      (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
    pdVar1 = (Qc->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar1[uVar2] = dVar4 + pdVar1[uVar2];
    return;
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChShaftsMotorSpeed::IntLoadConstraint_C(const unsigned int off_L,  // offset in Qc residual
                                        ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*C
                                        const double c,            // a scaling factor
                                        bool do_clamp,             // apply clamping to c*C?
                                        double recovery_clamp      // value for min/max clamping of c*C
                                        ) {
    // Add the time-dependent term in residual C as 
    //   C = d_error - d_setpoint - d_offset
    // with d_error = x_pos_A-x_pos_B, and d_setpoint = x(t)
    double C;
    if (this->avoid_angle_drift) 
        C = this->GetMotorRot()  - aux_dt - this->rot_offset; 
    else
        C = 0.0;

    double res = c * C;

    if (do_clamp) {
        res = ChMin(ChMax(res, -recovery_clamp), recovery_clamp);
    }
    Qc(off_L) += res;
}